

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::printRandomInitializer
               (ostringstream *oss,DataType type,Random *rnd)

{
  bool bVar1;
  int iVar2;
  DataType DVar3;
  int iVar4;
  char *pcVar5;
  ostream *poVar6;
  int local_28;
  int i;
  int size;
  Random *rnd_local;
  DataType type_local;
  ostringstream *oss_local;
  
  iVar2 = glu::getDataTypeScalarSize(type);
  if (0 < iVar2) {
    pcVar5 = glu::getDataTypeName(type);
    poVar6 = std::operator<<(&oss->super_basic_ostream<char,_std::char_traits<char>_>,pcVar5);
    std::operator<<(poVar6,"(");
  }
  for (local_28 = 0; local_28 < iVar2; local_28 = local_28 + 1) {
    pcVar5 = ", ";
    if (local_28 == 0) {
      pcVar5 = "";
    }
    std::operator<<(&oss->super_basic_ostream<char,_std::char_traits<char>_>,pcVar5);
    DVar3 = glu::getDataTypeScalarType(type);
    switch(DVar3) {
    case TYPE_FLOAT:
      iVar4 = de::Random::getInt(rnd,0,0x10);
      printFloat(oss,(double)iVar4 / 16.0);
      break;
    default:
      break;
    case TYPE_INT:
    case TYPE_UINT:
      iVar4 = de::Random::getInt(rnd,0,0xff);
      std::ostream::operator<<(oss,iVar4);
      break;
    case TYPE_BOOL:
      bVar1 = de::Random::getBool(rnd);
      pcVar5 = "false";
      if (bVar1) {
        pcVar5 = "true";
      }
      std::operator<<(&oss->super_basic_ostream<char,_std::char_traits<char>_>,pcVar5);
    }
  }
  if (0 < iVar2) {
    std::operator<<(&oss->super_basic_ostream<char,_std::char_traits<char>_>,")");
  }
  return;
}

Assistant:

void printRandomInitializer (ostringstream& oss, DataType type, Random& rnd)
{
	using namespace glu;
	const int		size	= getDataTypeScalarSize(type);

	if (size > 0)
		oss << getDataTypeName(type) << "(";

	for (int i = 0; i < size; ++i)
	{
		oss << (i == 0 ? "" : ", ");
		switch (getDataTypeScalarType(type))
		{
			case TYPE_FLOAT:
				printFloat(oss, rnd.getInt(0, 16) / 16.0);
				break;

			case TYPE_INT:
			case TYPE_UINT:
				oss << rnd.getInt(0, 255);
				break;

			case TYPE_BOOL:
				oss << (rnd.getBool() ? "true" : "false");
				break;

			default:
				DE_FATAL("Impossible");
		}
	}

	if (size > 0)
		oss << ")";
}